

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargePropagator.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargePropagator::initialize(FluctuatingChargePropagator *this)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  string *id;
  OptimizationMethod *pOVar4;
  long in_RDI;
  EndCriteria *this_00;
  OptimizationFactory *maxIterations;
  OptimizationMethod *minim;
  string chargeOptMethod;
  EndCriteria endCriteria;
  RealType initialStepSize;
  RealType tolerance;
  int maxIter;
  Problem problem;
  NoStatus noStatus;
  NoConstraint noConstraint;
  DynamicVector<double,_std::allocator<double>_> initCoords;
  FluctuatingChargeObjectiveFunction flucQobjf;
  SimInfo *in_stack_fffffffffffffe78;
  FluctuatingChargeConstraints *in_stack_fffffffffffffe80;
  SimInfo *in_stack_fffffffffffffe88;
  ForceManager *in_stack_fffffffffffffe90;
  SimInfo *in_stack_fffffffffffffe98;
  OptimizationFactory *this_01;
  Problem *in_stack_fffffffffffffea0;
  string local_120 [32];
  undefined1 local_100 [8];
  FluctuatingChargeObjectiveFunction *in_stack_ffffffffffffff08;
  undefined1 local_c0 [47];
  undefined1 in_stack_ffffffffffffff6f;
  FluctuatingChargeConstraints *in_stack_ffffffffffffff70;
  
  bVar1 = SimInfo::usesFluctuatingCharges(*(SimInfo **)(in_RDI + 0x18));
  if ((bVar1) && (iVar2 = SimInfo::getNFluctuatingCharges(*(SimInfo **)(in_RDI + 0x18)), 0 < iVar2))
  {
    *(undefined1 *)(in_RDI + 0x28) = 1;
    pvVar3 = operator_new(0x88);
    FluctuatingChargeConstraints::FluctuatingChargeConstraints
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    *(void **)(in_RDI + 0x10) = pvVar3;
    FluctuatingChargeParameters::getConstrainRegions((FluctuatingChargeParameters *)0x325da3);
    FluctuatingChargeConstraints::setConstrainRegions
              (in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  }
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x29) = 1;
  }
  else {
    bVar1 = FluctuatingChargeParameters::getDoInitialOptimization
                      ((FluctuatingChargeParameters *)0x325e06);
    if (bVar1) {
      FluctuatingChargeObjectiveFunction::FluctuatingChargeObjectiveFunction
                ((FluctuatingChargeObjectiveFunction *)in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 (FluctuatingChargeConstraints *)in_stack_fffffffffffffe88);
      FluctuatingChargeObjectiveFunction::setInitialCoords(in_stack_ffffffffffffff08);
      QuantLib::NoConstraint::NoConstraint((NoConstraint *)in_stack_fffffffffffffe80);
      NoStatus::NoStatus((NoStatus *)in_stack_fffffffffffffe80);
      QuantLib::Problem::Problem
                (in_stack_fffffffffffffea0,(ObjectiveFunction *)in_stack_fffffffffffffe98,
                 (Constraint *)in_stack_fffffffffffffe90,(StatusFunction *)in_stack_fffffffffffffe88
                 ,(DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80);
      FluctuatingChargeParameters::getMaxIterations((FluctuatingChargeParameters *)0x325ead);
      this_00 = (EndCriteria *)
                FluctuatingChargeParameters::getTolerance((FluctuatingChargeParameters *)0x325ecc);
      maxIterations =
           (OptimizationFactory *)
           FluctuatingChargeParameters::getInitialStepSize((FluctuatingChargeParameters *)0x325ef1);
      this_01 = maxIterations;
      QuantLib::EndCriteria::EndCriteria
                (this_00,(size_t)maxIterations,(size_t)in_stack_fffffffffffffe90,
                 (RealType)in_stack_fffffffffffffe88,(RealType)in_stack_fffffffffffffe80,
                 (RealType)in_stack_fffffffffffffe78);
      FluctuatingChargeParameters::getChargeOptimizationMethod_abi_cxx11_
                ((FluctuatingChargeParameters *)in_stack_fffffffffffffe78);
      id = (string *)OptimizationFactory::getInstance();
      pOVar4 = OptimizationFactory::createOptimization(this_01,id,in_stack_fffffffffffffe88);
      (*pOVar4->_vptr_OptimizationMethod[2])(maxIterations,pOVar4,local_c0,local_100);
      if (pOVar4 != (OptimizationMethod *)0x0) {
        (*pOVar4->_vptr_OptimizationMethod[1])();
      }
      std::__cxx11::string::~string(local_120);
      QuantLib::Problem::~Problem((Problem *)0x325fd6);
      NoStatus::~NoStatus((NoStatus *)0x325fe3);
      QuantLib::NoConstraint::~NoConstraint((NoConstraint *)0x325ff0);
      DynamicVector<double,_std::allocator<double>_>::~DynamicVector
                ((DynamicVector<double,_std::allocator<double>_> *)0x325ffd);
      FluctuatingChargeObjectiveFunction::~FluctuatingChargeObjectiveFunction
                ((FluctuatingChargeObjectiveFunction *)0x32600a);
    }
    *(undefined1 *)(in_RDI + 0x29) = 1;
  }
  return;
}

Assistant:

void FluctuatingChargePropagator::initialize() {
    if (info_->usesFluctuatingCharges()) {
      if (info_->getNFluctuatingCharges() > 0) {
        hasFlucQ_      = true;
        fqConstraints_ = new FluctuatingChargeConstraints(info_);
        fqConstraints_->setConstrainRegions(fqParams_->getConstrainRegions());
      }
    }

    if (!hasFlucQ_) {
      initialized_ = true;
      return;
    }

    // SimInfo::MoleculeIterator i;
    // Molecule::FluctuatingChargeIterator  j;
    // Molecule* mol;
    // Atom* atom;
    //
    // For single-minima flucq, this ensures a net neutral system, but
    // for multiple minima, this is no longer the right thing to do:
    //
    // for (mol = info_->beginMolecule(i); mol != NULL;
    //      mol = info_->nextMolecule(i)) {
    //   for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
    //        atom = mol->nextFluctuatingCharge(j)) {
    //     atom->setFlucQPos(0.0);
    //     atom->setFlucQVel(0.0);
    //   }
    // }

    if (fqParams_->getDoInitialOptimization()) {
      FluctuatingChargeObjectiveFunction flucQobjf(info_, forceMan_,
                                                   fqConstraints_);

      DynamicVector<RealType> initCoords = flucQobjf.setInitialCoords();

      NoConstraint noConstraint {};
      NoStatus noStatus {};

      Problem problem(flucQobjf, noConstraint, noStatus, initCoords);

      int maxIter              = fqParams_->getMaxIterations();
      RealType tolerance       = fqParams_->getTolerance();
      RealType initialStepSize = fqParams_->getInitialStepSize();

      EndCriteria endCriteria(maxIter, maxIter, tolerance, tolerance,
                              tolerance);
      std::string chargeOptMethod = fqParams_->getChargeOptimizationMethod();
      OptimizationMethod* minim =
          OptimizationFactory::getInstance().createOptimization(chargeOptMethod,
                                                                info_);

      minim->minimize(problem, endCriteria, initialStepSize);

      delete minim;
    }

    initialized_ = true;
  }